

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O3

bool __thiscall apngasm::APNGAsm::savePNGs(APNGAsm *this,string *outputDir)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  string outputPath;
  string local_58;
  string *local_38;
  
  uVar4 = (int)((long)(this->_frames).
                      super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_frames).
                      super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * 0x7a44c6b;
  if ((int)uVar4 < 1) {
    bVar7 = true;
  }
  else {
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    lVar3 = 0;
    uVar6 = 0;
    bVar7 = false;
    local_38 = outputDir;
    do {
      (**(code **)(*(long *)this->_listener + 0x40))
                (&local_58,this->_listener,local_38,uVar6 & 0xffffffff);
      cVar1 = (**(code **)(*(long *)this->_listener + 0x30))(this->_listener,&local_58);
      if ((cVar1 == '\0') ||
         (bVar2 = APNGFrame::save((APNGFrame *)
                                  ((long)((this->_frames).
                                          super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_palette +
                                  lVar3 + -0x11),&local_58), !bVar2)) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == &local_58.field_2) {
          return bVar7;
        }
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        return bVar7;
      }
      (**(code **)(*(long *)this->_listener + 0x38))(this->_listener,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
      bVar7 = uVar5 <= uVar6;
      lVar3 = lVar3 + 0x430;
    } while (uVar5 != uVar6);
  }
  return bVar7;
}

Assistant:

bool APNGAsm::savePNGs(const std::string& outputDir) const
  {
    const int count = _frames.size();
    for(int i = 0;  i < count;  ++i)
    {
      const std::string outputPath = _listener->onCreatePngPath(outputDir, i);

      if( !_listener->onPreSave(outputPath) )
        return false;

      if( !_frames[i].save(outputPath) )
        return false;

      _listener->onPostSave(outputPath);
    }
    return true;
  }